

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftpproto.c
# Opt level: O0

void handle_child(session_t *sess)

{
  int iVar1;
  ssize_t sVar2;
  int local_18;
  int map_size;
  int i;
  int ret;
  session_t *sess_local;
  
  ftp_relply(sess,0xdc,"(miniftpd 0.1)");
  do {
    memset(sess->cmdline,0,0x400);
    memset(sess->cmd,0,0x20);
    memset(sess->cmd_arg,0,0x400);
    start_cmdio_alarm();
    sVar2 = readline(sess->ctrl_fd,sess->cmdline,0x400);
    if ((int)sVar2 == -1) {
      perror("readline");
      exit(1);
    }
    if ((int)sVar2 == 0) {
      exit(0);
    }
    str_trim_crlf(sess->cmdline);
    str_split(sess->cmdline,sess->cmd,sess->cmd_arg,' ');
    str_upper(sess->cmd);
    for (local_18 = 0; local_18 < 0x29; local_18 = local_18 + 1) {
      iVar1 = strcmp(ctrl_cmds_map[local_18].cmd,sess->cmd);
      if (iVar1 == 0) {
        if (ctrl_cmds_map[local_18].cmd_func == (_func_void_session_t_ptr *)0x0) {
          ftp_relply(sess,0x1f6,"Unimplement command.");
        }
        else {
          (*ctrl_cmds_map[local_18].cmd_func)(sess);
        }
        break;
      }
    }
    if (local_18 == 0x29) {
      ftp_relply(sess,500,"Unknown command.");
    }
  } while( true );
}

Assistant:

void handle_child(session_t *sess) {
  ftp_relply(sess, FTP_GREET, "(miniftpd 0.1)");
  int ret;
  while (1) {
    memset(sess->cmdline, 0, MAX_COMMAND_LINE);
    memset(sess->cmd, 0, MAX_COMMAND);
    memset(sess->cmd_arg, 0, MAX_ARG);

    start_cmdio_alarm();

    ret = readline(sess->ctrl_fd, sess->cmdline, MAX_COMMAND_LINE);

    if (ret == -1)
      ERR_EXIT("readline");
    else if (ret == 0)
      exit(EXIT_SUCCESS);
    // 解析读取到的FTP命令与参数，处理FTP命令，然后发送给父进程
    //printf("%s", sess->cmdline);
    str_trim_crlf(sess->cmdline);
    //printf("%s\n", sess->cmdline);

    // 将命令与参数分割
    str_split(sess->cmdline, sess->cmd, sess->cmd_arg, ' ');
    //printf("%s %s\n",sess->cmd,sess->cmd_arg);
    // 将命令全部转化为大写
    str_upper(sess->cmd);

    int i;
    int map_size = sizeof(ctrl_cmds_map) / sizeof(ctrl_cmds_map[0]);
    for (i = 0; i < map_size; ++i) {
      if (strcmp(ctrl_cmds_map[i].cmd, sess->cmd) == 0) {
        if (ctrl_cmds_map[i].cmd_func != NULL) {
          ctrl_cmds_map[i].cmd_func(sess);
        } else {
          ftp_relply(sess, FTP_COMMANDNOTIMPL, "Unimplement command.");
        }
        break;
      }
    }
    if (i == map_size) {
      ftp_relply(sess, FTP_BADCMD, "Unknown command.");
    }
  }
}